

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,duckdb::interval_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  int iVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  unsigned_long *puVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  const_reference pvVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  bool bVar22;
  interval_t *lhs_data;
  idx_t local_80;
  idx_t local_78;
  idx_t local_68;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar3 = (lhs_format->unified).sel;
    pdVar2 = (lhs_format->unified).data;
    pdVar4 = rhs_row_locations->data;
    pvVar12 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar12;
      local_78 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar3->sel_vector;
      local_80 = 0;
      uVar15 = 0;
      do {
        uVar18 = uVar15;
        if (psVar6 != (sel_t *)0x0) {
          uVar18 = (ulong)psVar6[uVar15];
        }
        uVar13 = uVar18;
        if (psVar7 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar7[uVar18];
        }
        lVar9 = *(long *)(pdVar4 + uVar18 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar9 + (col_idx >> 3))) == 0) {
LAB_01292f0b:
          *no_match_count = local_78 + 1;
          no_match_sel->sel_vector[local_78] = (sel_t)uVar18;
          local_78 = local_78 + 1;
        }
        else {
          lVar10 = *(long *)(lVar9 + 8 + vVar5);
          uVar11 = *(undefined8 *)(lVar9 + vVar5);
          lVar14 = uVar13 * 0x10;
          iVar20 = (int)((ulong)uVar11 >> 0x20);
          iVar1 = *(int *)(pdVar2 + lVar14 + 4);
          lVar9 = *(long *)(pdVar2 + lVar14 + 8);
          iVar19 = (int)uVar11;
          if (((*(int *)(pdVar2 + lVar14) != iVar19) || (iVar1 != iVar20)) ||
             (iVar20 = iVar1, lVar9 != lVar10)) {
            lVar17 = (long)iVar1 + lVar9 / 86400000000;
            lVar21 = (long)iVar20 + lVar10 / 86400000000;
            if ((((long)*(int *)(pdVar2 + lVar14) + lVar17 / 0x1e != (long)iVar19 + lVar21 / 0x1e)
                || (lVar17 % 0x1e != lVar21 % 0x1e)) ||
               (lVar9 % 86400000000 != lVar10 % 86400000000)) goto LAB_01292f0b;
          }
          psVar6[local_80] = (sel_t)uVar18;
          local_80 = local_80 + 1;
        }
        uVar15 = uVar15 + 1;
        if (count == uVar15) {
          return local_80;
        }
      } while( true );
    }
  }
  else {
    pdVar2 = rhs_row_locations->data;
    pSVar3 = (lhs_format->unified).sel;
    pdVar4 = (lhs_format->unified).data;
    pvVar12 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar12;
      local_68 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar3->sel_vector;
      puVar8 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      local_80 = 0;
      uVar15 = 0;
      do {
        uVar18 = uVar15;
        if (psVar6 != (sel_t *)0x0) {
          uVar18 = (ulong)psVar6[uVar15];
        }
        uVar13 = uVar18;
        if (psVar7 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar7[uVar18];
        }
        if (puVar8 == (unsigned_long *)0x0) {
          bVar22 = false;
        }
        else {
          bVar22 = (puVar8[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0;
        }
        lVar9 = *(long *)(pdVar2 + uVar18 * 8);
        uVar16 = (uint)*(byte *)(lVar9 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7);
        if ((bVar22 == false) && (uVar16 != 0)) {
          lVar10 = *(long *)(lVar9 + 8 + vVar5);
          uVar11 = *(undefined8 *)(lVar9 + vVar5);
          lVar14 = uVar13 * 0x10;
          iVar20 = (int)((ulong)uVar11 >> 0x20);
          iVar1 = *(int *)(pdVar4 + lVar14 + 4);
          lVar9 = *(long *)(pdVar4 + lVar14 + 8);
          iVar19 = (int)uVar11;
          if (((*(int *)(pdVar4 + lVar14) != iVar19) || (iVar1 != iVar20)) ||
             (iVar20 = iVar1, lVar9 != lVar10)) {
            lVar17 = (long)iVar1 + lVar9 / 86400000000;
            lVar21 = (long)iVar20 + lVar10 / 86400000000;
            if ((((long)*(int *)(pdVar4 + lVar14) + lVar17 / 0x1e != (long)iVar19 + lVar21 / 0x1e)
                || (lVar17 % 0x1e != lVar21 % 0x1e)) ||
               (lVar9 % 86400000000 != lVar10 % 86400000000)) goto LAB_01292cf9;
          }
LAB_01292d2c:
          psVar6[local_80] = (sel_t)uVar18;
          local_80 = local_80 + 1;
        }
        else {
          if (bVar22 == (uVar16 == 0)) goto LAB_01292d2c;
LAB_01292cf9:
          *no_match_count = local_68 + 1;
          no_match_sel->sel_vector[local_68] = (sel_t)uVar18;
          local_68 = local_68 + 1;
        }
        uVar15 = uVar15 + 1;
        if (count == uVar15) {
          return local_80;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}